

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtering.cpp
# Opt level: O2

void Image_Function::Prewitt
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  imageException *this;
  FilterKernel<3U> *pFVar9;
  uint uVar10;
  uchar *puVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uchar *puVar15;
  long lVar16;
  uchar *puVar17;
  long lVar18;
  uint8_t uVar19;
  uchar *puVar20;
  long lVar21;
  uchar *puVar22;
  ulong uVar23;
  uchar *puVar24;
  uchar *puVar25;
  uint uVar26;
  uchar *__s;
  uchar *puVar27;
  ulong uVar28;
  uchar *puVar29;
  undefined1 auVar30 [16];
  undefined1 in_register_000012c4 [12];
  ImageTemplate<unsigned_char> local_58;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_58,out);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,&local_58);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_58);
  if ((2 < width) && (2 < height)) {
    uVar1 = in->_width;
    uVar2 = in->_height;
    uVar14 = startYIn + 1 + height;
    uVar3 = in->_rowSize;
    uVar13 = (ulong)uVar3;
    uVar10 = startXIn + 1 + width;
    uVar28 = (ulong)(startXIn != 0);
    puVar5 = in->_data;
    uVar23 = (ulong)(((startYIn + 1) - (uint)(startYIn != 0)) * uVar3);
    uVar4 = out->_rowSize;
    __s = out->_data + (ulong)startXOut + (ulong)(startYOut * uVar4);
    if (startYIn == 0) {
      memset(__s,0,(ulong)width);
      __s = __s + uVar4;
    }
    lVar7 = (uVar23 + startXIn) - uVar28;
    if (Prewitt(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)
        ::kernel == '\0') {
      iVar8 = __cxa_guard_acquire();
      if (iVar8 != 0) {
        pFVar9 = &Prewitt::kernel;
        for (lVar21 = 0; lVar21 != 0x300; lVar21 = lVar21 + 1) {
          lVar16 = 0;
          for (lVar18 = 0; lVar21 + lVar18 != 0x300; lVar18 = lVar18 + 1) {
            iVar8 = (int)(lVar21 + lVar18);
            auVar30._0_4_ = (float)(iVar8 * iVar8 + (int)lVar21 * (int)lVar21);
            auVar30._4_12_ = in_register_000012c4;
            auVar30 = vsqrtss_avx(auVar30,auVar30);
            auVar30 = vfmadd213ss_fma(auVar30,SUB6416(ZEXT464(0x3e715bf0),0),
                                      SUB6416(ZEXT464(0x3f000000),0));
            uVar19 = (uint8_t)(int)auVar30._0_4_;
            *(uint8_t *)((long)pFVar9 + lVar16) = uVar19;
            *(uint8_t *)((long)pFVar9 + lVar18) = uVar19;
            lVar16 = lVar16 + 0x300;
          }
          pFVar9 = (FilterKernel<3U> *)((long)pFVar9 + 0x301);
        }
        __cxa_guard_release(&Prewitt(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)
                             ::kernel);
      }
    }
    lVar21 = startXIn - uVar28;
    lVar16 = uVar23 + 1 + lVar21;
    lVar21 = lVar21 + uVar23;
    puVar20 = puVar5 + lVar21;
    puVar17 = puVar5 + (ulong)(uVar3 + 1) + lVar21 + 1;
    puVar22 = puVar5 + lVar21 + (ulong)(uVar3 - 1) + 1;
    puVar15 = puVar5 + (lVar16 - (ulong)(uVar3 + 1));
    puVar24 = puVar5 + (lVar16 - (ulong)(uVar3 - 1));
    puVar11 = puVar5 + (lVar16 - uVar13);
    puVar25 = puVar5 + lVar21 + uVar13 + 1;
    for (puVar27 = puVar5 + lVar7 + 1;
        puVar27 !=
        puVar5 + (ulong)((height + (startYIn != 0) + (uint)(uVar14 < uVar2) + -2) * uVar3) +
                 lVar7 + 1; puVar27 = puVar27 + uVar13) {
      puVar29 = __s;
      if (startXIn == 0) {
        puVar29 = __s + 1;
        *__s = '\0';
      }
      for (uVar28 = 0; (startXIn != 0 | 0xfffffffe) + width + (uint)(uVar10 < uVar1) != uVar28;
          uVar28 = uVar28 + 1) {
        uVar12 = ((uint)puVar20[uVar28] + (uint)puVar22[uVar28] +
                 ((uint)puVar15[uVar28] - (uint)puVar17[uVar28])) -
                 ((uint)puVar20[uVar28 + 2] + (uint)puVar24[uVar28]);
        uVar26 = ((uint)puVar11[uVar28] + (uint)puVar24[uVar28] +
                 (((uint)puVar15[uVar28] - (uint)puVar17[uVar28]) - (uint)puVar22[uVar28])) -
                 (uint)puVar25[uVar28];
        uVar6 = -uVar12;
        if (0 < (int)uVar12) {
          uVar6 = uVar12;
        }
        uVar12 = -uVar26;
        if (0 < (int)uVar26) {
          uVar12 = uVar26;
        }
        puVar29[uVar28] = Prewitt::kernel.kernel[uVar6][uVar12];
      }
      if (uVar1 <= uVar10) {
        puVar29[uVar28] = '\0';
      }
      __s = __s + uVar4;
      puVar15 = puVar15 + uVar13;
      puVar17 = puVar17 + uVar13;
      puVar20 = puVar20 + uVar13;
      puVar22 = puVar22 + uVar13;
      puVar24 = puVar24 + uVar13;
      puVar11 = puVar11 + uVar13;
      puVar25 = puVar25 + uVar13;
    }
    if (uVar2 <= uVar14) {
      memset(__s,0,(ulong)width);
    }
    return;
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this,"Input image is very small for Sobel filter to be applied");
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void Prewitt( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                  uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( in, out );

        if( width < 3 || height < 3 )
            throw imageException( "Input image is very small for Sobel filter to be applied" );

        const uint32_t startXOffset = (startXIn > 0u) ? 1u : 0u;
        const uint32_t startYOffset = (startYIn > 0u) ? 1u : 0u;
        const uint32_t endXOffset   = ((startXIn + width  + 1u) < in.width ()) ? 1u : 0u;
        const uint32_t endYOffset   = ((startYIn + height + 1u) < in.height()) ? 1u : 0u;

        // Create the map of gradient values
        const uint32_t gradientWidth  = width  - ( ((startXOffset > 0u) ? 0u : 1u) + ((endXOffset > 0u) ? 0u : 1u) );
        const uint32_t gradientHeight = height - ( ((startYOffset > 0u) ? 0u : 1u) + ((endYOffset > 0u) ? 0u : 1u) );

        const float multiplier = 1.0f / ( 3.0f * sqrtf( 2.0f ) );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + (startYIn + 1u - startYOffset) * rowSizeIn + startXIn + 1u - startXOffset;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        const uint8_t * inYEnd = inY + gradientHeight * rowSizeIn;

        if ( startYOffset == 0u ) {
            // fill top row with zeros
            memset( outY, 0, width );
            outY += rowSizeOut;
        }

        const uint32_t yPlusX  = rowSizeIn + 1u;
        const uint32_t yMinusX = rowSizeIn - 1u;

        static const FilterKernel<3u> kernel(multiplier);

        for( ; inY != inYEnd; inY += rowSizeIn, outY += rowSizeOut ) {
            uint8_t       * outX   = outY;

            if ( startXOffset == 0u ) {
                // set first pixel in row to 0
                *outX = 0;
                ++outX;
            }

            const uint8_t * inX    = inY;
            const uint8_t * inXEnd = inX + gradientWidth;

            for( ; inX != inXEnd; ++inX, ++outX ) {
                //      | +1  0 -1|
                // Gx = | +1  0 -1|
                //      | +1  0 -1|

                //      | +1 +1 +1|
                // Gy = |  0  0  0|
                //      | -1 -1 -1|

                const int32_t partialG = static_cast<int32_t>(*(inX - yPlusX )) - *(inX + yPlusX );  // [y - 1; x - 1] - [y + 1; x + 1]

                const int32_t gX = partialG + *(inX - 1        ) + *(inX + yMinusX) - *(inX - yMinusX) - *(inX + 1        );
                const int32_t gY = partialG + *(inX - rowSizeIn) + *(inX - yMinusX) - *(inX + yMinusX) - *(inX + rowSizeIn);

                *outX = kernel.kernel[(gX < 0) ? -gX : gX][(gY < 0) ? -gY : gY];
            }

            if ( endXOffset == 0u ) {
                // set last pixel in row to 0
                *outX = 0;
            }
        }

        if ( endYOffset == 0u ) {
            // fill bottom row with zeros
            memset( outY, 0, width );
        }
    }